

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O3

int lws_gate_accepts(lws_context *context,int on)

{
  int iVar1;
  lws_vhost *plVar2;
  lws_dll2 *plVar3;
  
  plVar2 = context->vhost_list;
  _lws_log(4,"%s: on = %d\n","lws_gate_accepts",on);
  if (plVar2 != (lws_vhost *)0x0) {
    do {
      for (plVar3 = (plVar2->listen_wsi).head; plVar3 != (lws_dll2 *)0x0; plVar3 = plVar3->next) {
        if ((plVar2->tls).use_ssl != 0) {
          iVar1 = lws_change_pollfd((lws *)&plVar3[-0x1b].next,(uint)(on == 0),(uint)(on != 0));
          if (iVar1 != 0) {
            _lws_log(4,"%s: Unable to set POLLIN %d\n","lws_gate_accepts",on);
          }
        }
      }
      plVar2 = plVar2->vhost_next;
    } while (plVar2 != (lws_vhost *)0x0);
  }
  return 0;
}

Assistant:

int
lws_gate_accepts(struct lws_context *context, int on)
{
	struct lws_vhost *v = context->vhost_list;

	lwsl_notice("%s: on = %d\n", __func__, on);

	while (v) {
		lws_start_foreach_dll(struct lws_dll2 *, d,
				      lws_dll2_get_head(&v->listen_wsi)) {
			struct lws *wsi = lws_container_of(d, struct lws,
							   listen_list);

			if (v->tls.use_ssl &&
			    lws_change_pollfd(wsi, on ? 0 : LWS_POLLIN,
						   on ? LWS_POLLIN : 0))
				lwsl_notice("%s: Unable to set POLLIN %d\n",
					    __func__, on);
		} lws_end_foreach_dll(d);

		v = v->vhost_next;
	}

	return 0;
}